

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::anon_unknown_173::print_relationship
                   (string *__return_storage_ptr__,Relationship *rel,ListEditQual *qual,bool custom,
                   string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual v;
  string local_220;
  string local_200;
  string local_1e0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream aoStack_1b0 [380];
  uint local_34;
  string *psStack_30;
  uint32_t indent_local;
  string *name_local;
  ListEditQual *pLStack_20;
  bool custom_local;
  ListEditQual *qual_local;
  Relationship *rel_local;
  
  local_34 = indent;
  psStack_30 = name;
  name_local._7_1_ = custom;
  pLStack_20 = qual;
  qual_local = &rel->type;
  rel_local = (Relationship *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1c0);
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)local_34,n);
  ::std::operator<<(aoStack_1b0,(string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  v = extraout_EDX;
  if ((name_local._7_1_ & 1) != 0) {
    ::std::operator<<(aoStack_1b0,"custom ");
    v = extraout_EDX_00;
  }
  if (*pLStack_20 != ResetToExplicit) {
    tinyusdz::to_string_abi_cxx11_(&local_200,(tinyusdz *)(ulong)*pLStack_20,v);
    poVar2 = ::std::operator<<(aoStack_1b0,(string *)&local_200);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::~string((string *)&local_200);
  }
  bVar1 = Relationship::is_varying_authored((Relationship *)qual_local);
  if (bVar1) {
    ::std::operator<<(aoStack_1b0,"varying ");
  }
  print_rel_only(&local_220,(Relationship *)qual_local,psStack_30,local_34);
  ::std::operator<<(aoStack_1b0,(string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_relationship(const Relationship &rel,
                               const ListEditQual &qual, const bool custom,
                               const std::string &name, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent);

  if (custom) {
    ss << "custom ";
  }

  // List editing
  if (qual != ListEditQual::ResetToExplicit) {
    ss << to_string(qual) << " ";
  }

  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}